

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Error __thiscall asmjit::v1_14::BaseEmitter::onDetach(BaseEmitter *this,CodeHolder *code)

{
  EmitterFlags EVar1;
  
  EVar1 = this->_emitterFlags;
  if ((EVar1 & kOwnLogger) == kNone) {
    this->_logger = (Logger *)0x0;
  }
  if ((EVar1 & kOwnErrorHandler) == kNone) {
    this->_errorHandler = (ErrorHandler *)0x0;
  }
  this->_emitterFlags = EVar1 & (kOwnErrorHandler|kOwnLogger);
  this->_instructionAlignment = '\0';
  this->_forcedInstOptions = kReserved;
  this->_privateData = 0;
  (this->_funcs).validate = (ValidateFunc)0x0;
  (this->_environment)._arch = kUnknown;
  (this->_environment)._subArch = kHost;
  (this->_environment)._vendor = kHost;
  (this->_environment)._platform = kUnknown;
  (this->_environment)._platformABI = kUnknown;
  (this->_environment)._objectFormat = kUnknown;
  (this->_environment)._floatABI = kHardFloat;
  (this->_environment)._reserved = '\0';
  this->_gpSignature = 0;
  this->_instOptions = kNone;
  (this->_extraReg)._signature = 0;
  (this->_extraReg)._id = 0;
  this->_inlineComment = (char *)0x0;
  (this->_funcs).emitProlog = (EmitProlog)0x0;
  (this->_funcs).emitEpilog = (EmitEpilog)0x0;
  (this->_funcs).emitArgsAssignment = (EmitArgsAssignment)0x0;
  return 0;
}

Assistant:

Error BaseEmitter::onDetach(CodeHolder* code) noexcept {
  DebugUtils::unused(code);

  if (!hasOwnLogger())
    _logger = nullptr;

  if (!hasOwnErrorHandler())
    _errorHandler = nullptr;

  _clearEmitterFlags(~kEmitterPreservedFlags);
  _instructionAlignment = uint8_t(0);
  _forcedInstOptions = InstOptions::kReserved;
  _privateData = 0;

  _environment.reset();
  _gpSignature.reset();

  _instOptions = InstOptions::kNone;
  _extraReg.reset();
  _inlineComment = nullptr;
  _funcs.reset();

  return kErrorOk;
}